

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

bool __thiscall cppnet::RWSocket::Write(RWSocket *this,char *src,uint32_t len)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *this_00;
  Event *pEVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 local_68 [8];
  shared_ptr<cppnet::EventActions> actions;
  enable_shared_from_this<cppnet::RWSocket> local_48;
  shared_ptr<cppnet::Socket> local_38;
  uint32_t local_24;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  uint32_t len_local;
  char *src_local;
  RWSocket *this_local;
  
  local_24 = len;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src;
  src_local = (char *)this;
  if (this->_event == (Event *)0x0) {
    this_00 = std::
              __shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_alloter);
    pEVar4 = AlloterWrap::PoolNew<cppnet::Event>(this_00);
    this->_event = pEVar4;
    pEVar4 = this->_event;
    std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_48);
    std::shared_ptr<cppnet::Socket>::shared_ptr<cppnet::RWSocket,void>
              (&local_38,(shared_ptr<cppnet::RWSocket> *)&local_48);
    Event::SetSocket(pEVar4,&local_38);
    std::shared_ptr<cppnet::Socket>::~shared_ptr(&local_38);
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_48);
  }
  peVar5 = std::__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_write_buffer);
  iVar2 = (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
  if (iVar2 == 0) {
    peVar5 = std::__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_write_buffer);
    (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
              (peVar5,_Stack_20._M_pi,(ulong)local_24);
    this_local._7_1_ = Send(this);
  }
  else {
    peVar5 = std::__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_write_buffer);
    uVar3 = (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    if (uVar3 < 0x400001) {
      peVar5 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_write_buffer);
      (*(peVar5->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                (peVar5,_Stack_20._M_pi,(ulong)local_24);
      Socket::GetEventActions((Socket *)local_68);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
        iVar2 = (*peVar6->_vptr_EventActions[4])(peVar6,this->_event);
        this_local._7_1_ = (byte)iVar2 & 1;
      }
      else {
        this_local._7_1_ = 0;
      }
      std::shared_ptr<cppnet::EventActions>::~shared_ptr
                ((shared_ptr<cppnet::EventActions> *)local_68);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RWSocket::Write(const char* src, uint32_t len) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    //can't send now
    if (_write_buffer->GetCanReadLength() > 0) {
        if (_write_buffer->GetCanReadLength() > __max_write_cache) {
            return false;
        }
        
        _write_buffer->Write(src, len);
        auto actions = GetEventActions();
        if (actions) {
            return actions->AddSendEvent(_event);
        }
        return false;

    } else {
        _write_buffer->Write(src, len);
        return Send();
    }
}